

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall
server_response::remove_waiting_task_ids
          (server_response *this,
          unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *id_tasks)

{
  common_log *log;
  __node_base *p_Var1;
  unique_lock<std::mutex> lock;
  
  httplib::detail::std::unique_lock<std::mutex>::unique_lock(&lock,&this->mutex_results);
  p_Var1 = &(id_tasks->_M_h)._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    if (0 < common_log_verbosity_thold) {
      log = common_log_main();
      common_log_add(log,GGML_LOG_LEVEL_DEBUG,
                     "srv  %12.*s: remove task %d from waiting list. current waiting = %d (before remove)\n"
                     ,0xc,"remove_waiting_task_ids",(ulong)(uint)*(size_type *)(p_Var1 + 1),
                     (int)(this->waiting_task_ids)._M_h._M_element_count);
    }
    httplib::detail::std::
    _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(&(this->waiting_task_ids)._M_h,p_Var1 + 1);
  }
  httplib::detail::std::unique_lock<std::mutex>::~unique_lock(&lock);
  return;
}

Assistant:

void remove_waiting_task_ids(const std::unordered_set<int> & id_tasks) {
        std::unique_lock<std::mutex> lock(mutex_results);

        for (const auto & id_task : id_tasks) {
            SRV_DBG("remove task %d from waiting list. current waiting = %d (before remove)\n", id_task, (int) waiting_task_ids.size());
            waiting_task_ids.erase(id_task);
        }
    }